

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ApplyBrace * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2,AST **args_3)

{
  ApplyBrace *right;
  ApplyBrace *r;
  AST *in_stack_ffffffffffffffb8;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
  *in_stack_ffffffffffffffc0;
  LocationRange *in_stack_ffffffffffffffc8;
  ApplyBrace *in_stack_ffffffffffffffd0;
  
  right = (ApplyBrace *)operator_new(0x90);
  ApplyBrace::ApplyBrace
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(Fodder *)in_stack_ffffffffffffffc0
             ,in_stack_ffffffffffffffb8,(AST *)right);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)right);
  return right;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }